

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O3

void knote_index_RB_INSERT_COLOR(knote_index *head,knote *elm)

{
  knote *pkVar1;
  knote *pkVar2;
  knote *pkVar3;
  anon_struct_32_4_548b78d9_for_kn_index *paVar4;
  knote *pkVar5;
  knote *pkVar6;
  
  pkVar5 = (elm->kn_index).rbe_parent;
  do {
    if ((pkVar5 == (knote *)0x0) || ((pkVar5->kn_index).rbe_color != 1)) {
      (head->rbh_root->kn_index).rbe_color = 0;
      return;
    }
    pkVar1 = (pkVar5->kn_index).rbe_parent;
    pkVar6 = (pkVar1->kn_index).rbe_left;
    pkVar3 = elm;
    if (pkVar5 == pkVar6) {
      pkVar2 = (pkVar1->kn_index).rbe_right;
      if ((pkVar2 != (knote *)0x0) && ((pkVar2->kn_index).rbe_color == 1)) {
        (pkVar2->kn_index).rbe_color = 0;
        goto LAB_00103534;
      }
      pkVar2 = (pkVar5->kn_index).rbe_right;
      if (pkVar2 == elm) {
        pkVar6 = (pkVar2->kn_index).rbe_left;
        (pkVar5->kn_index).rbe_right = pkVar6;
        if (pkVar6 == (knote *)0x0) {
          (pkVar2->kn_index).rbe_parent = pkVar1;
LAB_00103626:
          pkVar6 = (pkVar5->kn_index).rbe_parent;
          paVar4 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar6->kn_index).rbe_right;
          if (pkVar5 == (pkVar6->kn_index).rbe_left) {
            paVar4 = &pkVar6->kn_index;
          }
        }
        else {
          (pkVar6->kn_index).rbe_parent = pkVar5;
          pkVar6 = (pkVar5->kn_index).rbe_parent;
          (pkVar2->kn_index).rbe_parent = pkVar6;
          paVar4 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
          if (pkVar6 != (knote *)0x0) goto LAB_00103626;
        }
        paVar4->rbe_left = pkVar2;
        (pkVar2->kn_index).rbe_left = pkVar5;
        (pkVar5->kn_index).rbe_parent = pkVar2;
        pkVar6 = (pkVar1->kn_index).rbe_left;
        pkVar3 = pkVar5;
        pkVar5 = elm;
      }
      (pkVar5->kn_index).rbe_color = 0;
      (pkVar1->kn_index).rbe_color = 1;
      pkVar5 = (pkVar6->kn_index).rbe_right;
      (pkVar1->kn_index).rbe_left = pkVar5;
      if (pkVar5 != (knote *)0x0) {
        (pkVar5->kn_index).rbe_parent = pkVar1;
      }
      pkVar5 = (pkVar1->kn_index).rbe_parent;
      (pkVar6->kn_index).rbe_parent = pkVar5;
      paVar4 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
      if (pkVar5 != (knote *)0x0) {
        paVar4 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar5->kn_index).rbe_right;
        if (pkVar1 == (pkVar5->kn_index).rbe_left) {
          paVar4 = &pkVar5->kn_index;
        }
      }
      paVar4->rbe_left = pkVar6;
      (pkVar6->kn_index).rbe_right = pkVar1;
      (pkVar1->kn_index).rbe_parent = pkVar6;
    }
    else if ((pkVar6 == (knote *)0x0) || ((pkVar6->kn_index).rbe_color != 1)) {
      pkVar6 = (pkVar5->kn_index).rbe_left;
      if (pkVar6 == elm) {
        pkVar3 = (pkVar6->kn_index).rbe_right;
        (pkVar5->kn_index).rbe_left = pkVar3;
        if (pkVar3 == (knote *)0x0) {
          (pkVar6->kn_index).rbe_parent = pkVar1;
LAB_001035af:
          pkVar3 = (pkVar5->kn_index).rbe_parent;
          paVar4 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar3->kn_index).rbe_right;
          if (pkVar5 == (pkVar3->kn_index).rbe_left) {
            paVar4 = &pkVar3->kn_index;
          }
        }
        else {
          (pkVar3->kn_index).rbe_parent = pkVar5;
          pkVar3 = (pkVar5->kn_index).rbe_parent;
          (pkVar6->kn_index).rbe_parent = pkVar3;
          paVar4 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
          if (pkVar3 != (knote *)0x0) goto LAB_001035af;
        }
        paVar4->rbe_left = pkVar6;
        (pkVar6->kn_index).rbe_right = pkVar5;
        (pkVar5->kn_index).rbe_parent = pkVar6;
        pkVar3 = pkVar5;
        pkVar5 = elm;
      }
      (pkVar5->kn_index).rbe_color = 0;
      (pkVar1->kn_index).rbe_color = 1;
      pkVar5 = (pkVar1->kn_index).rbe_right;
      pkVar6 = (pkVar5->kn_index).rbe_left;
      (pkVar1->kn_index).rbe_right = pkVar6;
      if (pkVar6 != (knote *)0x0) {
        (pkVar6->kn_index).rbe_parent = pkVar1;
      }
      pkVar6 = (pkVar1->kn_index).rbe_parent;
      (pkVar5->kn_index).rbe_parent = pkVar6;
      paVar4 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
      if (pkVar6 != (knote *)0x0) {
        paVar4 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar6->kn_index).rbe_right;
        if (pkVar1 == (pkVar6->kn_index).rbe_left) {
          paVar4 = &pkVar6->kn_index;
        }
      }
      paVar4->rbe_left = pkVar5;
      (pkVar5->kn_index).rbe_left = pkVar1;
      (pkVar1->kn_index).rbe_parent = pkVar5;
    }
    else {
      (pkVar6->kn_index).rbe_color = 0;
LAB_00103534:
      (pkVar5->kn_index).rbe_color = 0;
      (pkVar1->kn_index).rbe_color = 1;
      pkVar3 = pkVar1;
    }
    pkVar5 = (pkVar3->kn_index).rbe_parent;
    elm = pkVar3;
  } while( true );
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}